

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Cord * __thiscall absl::lts_20250127::Cord::AssignLargeString(Cord *this,string *src)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  CordRep *rep;
  Nonnull<CordRep_*> pCVar3;
  CordzInfo *this_00;
  long in_FS_OFFSET;
  CordzUpdateScope scope;
  CordzUpdateScope local_28;
  
  if (src->_M_string_length < 0x200) {
    __assert_fail("src.size() > kMaxBytesToCopy",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x17b,"Cord &absl::Cord::AssignLargeString(std::string &&)");
  }
  pCVar3 = CordRepFromString(src);
  rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if (rep == (CordRep *)0x0 || ((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    if (pCVar3 == (Nonnull<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4e8,
                    "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar3;
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
    if (*(long *)(in_FS_OFFSET + -0x58) < 2) {
      AssignLargeString();
    }
    else {
      *(long *)(in_FS_OFFSET + -0x58) = *(long *)(in_FS_OFFSET + -0x58) + -1;
    }
  }
  else {
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
    local_28.info_ = this_00;
    if (this_00 != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Lock(this_00,kAssignString);
    }
    if (pCVar3 == (Nonnull<CordRep_*>)0x0) {
      __assert_fail("rep",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f6,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
      __assert_fail("data_.is_tree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x4f7,
                    "void absl::Cord::InlineRep::SetTree(absl::Nonnull<CordRep *>, const CordzUpdateScope &)"
                   );
    }
    (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar3;
    if (this_00 != (CordzInfo *)0x0) {
      Mutex::AssertHeld(&this_00->mutex_);
      this_00->rep_ = pCVar3;
    }
    LOCK();
    pRVar1 = &rep->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar2 == 2) {
      cord_internal::CordRep::Destroy(rep);
    }
    cord_internal::CordzUpdateScope::~CordzUpdateScope(&local_28);
  }
  return this;
}

Assistant:

Cord& Cord::AssignLargeString(std::string&& src) {
  auto constexpr method = CordzUpdateTracker::kAssignString;
  assert(src.size() > kMaxBytesToCopy);
  CordRep* rep = CordRepFromString(std::move(src));
  if (CordRep* tree = contents_.tree()) {
    CordzUpdateScope scope(contents_.cordz_info(), method);
    contents_.SetTree(rep, scope);
    CordRep::Unref(tree);
  } else {
    contents_.EmplaceTree(rep, method);
  }
  return *this;
}